

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

ssize_t __thiscall Process::Arguments::read(Arguments *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *pcVar4;
  Arguments *extraout_RAX;
  Arguments *extraout_RAX_00;
  usize uVar5;
  Arguments *extraout_RAX_01;
  undefined4 in_register_00000034;
  Arguments *pAVar6;
  usize local_80;
  usize local_78;
  usize len;
  usize len_2;
  Option *opt_1;
  usize len_1;
  char *argName;
  Option *opt;
  usize argLen;
  char *end;
  String *argument_local;
  int *character_local;
  Arguments *this_local;
  
  pAVar6 = (Arguments *)CONCAT44(in_register_00000034,__fd);
  bVar2 = nextChar(this);
  if (!bVar2) {
    this_local._7_1_ = 0;
    this = (Arguments *)CONCAT71(extraout_var,bVar2);
    goto LAB_0010584a;
  }
  if ((((this->inOpt & 1U) == 0) && ((this->skipOpt & 1U) == 0)) && (*this->arg == '-')) {
    if (this->arg[1] == '-') {
      this->arg = this->arg + 2;
      if (*this->arg != '\0') {
        pcVar4 = String::find(this->arg,'=');
        if (pcVar4 == (char *)0x0) {
          local_78 = String::length(this->arg);
        }
        else {
          local_78 = (long)pcVar4 - (long)this->arg;
        }
        for (argName = (char *)this->options; argName < this->optionsEnd; argName = argName + 0x18)
        {
          if (((*(long *)(argName + 8) != 0) &&
              (iVar3 = String::compare(*(char **)(argName + 8),this->arg,local_78), iVar3 == 0)) &&
             (*(char *)(*(long *)(argName + 8) + local_78) == '\0')) {
            pcVar1 = this->arg;
            *(undefined4 *)&pAVar6->argv = *(undefined4 *)argName;
            if (pcVar4 == (char *)0x0) {
              local_80 = local_78;
            }
            else {
              local_80 = local_78 + 1;
            }
            this->arg = this->arg + local_80;
            if ((*(uint *)(argName + 0x10) & 1) != 0) {
              if ((pcVar4 != (char *)0x0) ||
                 (((*(uint *)(argName + 0x10) & 2) == 0 && (bVar2 = nextChar(this), bVar2)))) {
                uVar5 = String::length(this->arg);
                String::attach((String *)__buf,this->arg,uVar5);
                this->arg = this->arg + uVar5;
                this_local._7_1_ = 1;
                goto LAB_0010584a;
              }
              if ((*(uint *)(argName + 0x10) & 2) == 0) {
                String::attach((String *)__buf,pcVar1 + -2,local_78 + 2);
                *(undefined4 *)&pAVar6->argv = 0x3a;
                this_local._7_1_ = 1;
                this = pAVar6;
                goto LAB_0010584a;
              }
            }
            String::clear((String *)__buf);
            this_local._7_1_ = 1;
            this = extraout_RAX;
            goto LAB_0010584a;
          }
        }
        *(undefined4 *)&pAVar6->argv = 0x3f;
        uVar5 = String::length(this->arg + local_78);
        String::attach((String *)__buf,this->arg + -2,uVar5 + local_78 + 2);
        this->arg = this->arg + uVar5 + local_78;
        this_local._7_1_ = 1;
        goto LAB_0010584a;
      }
      this->skipOpt = true;
      bVar2 = nextChar(this);
      if (!bVar2) {
        this_local._7_1_ = 0;
        this = (Arguments *)CONCAT71(extraout_var_00,bVar2);
        goto LAB_0010584a;
      }
    }
    else {
      pcVar4 = this->arg;
      this->arg = pcVar4 + 1;
      if (pcVar4[1] == '\0') {
        *(undefined4 *)&pAVar6->argv = 0;
        String::attach((String *)__buf,this->arg + -1,1);
        this_local._7_1_ = 1;
        this = extraout_RAX_00;
        goto LAB_0010584a;
      }
      this->inOpt = true;
    }
  }
  if ((this->inOpt & 1U) == 0) {
    *(undefined4 *)&pAVar6->argv = 0;
    uVar5 = String::length(this->arg);
    String::attach((String *)__buf,this->arg,uVar5);
    this->arg = this->arg + uVar5;
    this_local._7_1_ = 1;
  }
  else {
    pcVar4 = this->arg;
    this->arg = pcVar4 + 1;
    *(int *)&pAVar6->argv = (int)*pcVar4;
    for (len_2 = (usize)this->options; len_2 < this->optionsEnd; len_2 = len_2 + 0x18) {
      if (*(int *)len_2 == *(int *)&pAVar6->argv) {
        if (((*(uint *)(len_2 + 0x10) & 1) == 0) || ((*(uint *)(len_2 + 0x10) & 2) != 0)) {
          String::clear((String *)__buf);
          this_local._7_1_ = 1;
          this = extraout_RAX_01;
        }
        else if ((*this->arg != '\0') || (bVar2 = nextChar(this), bVar2)) {
          uVar5 = String::length(this->arg);
          String::attach((String *)__buf,this->arg,uVar5);
          this->arg = this->arg + uVar5;
          this_local._7_1_ = 1;
        }
        else {
          String::clear((String *)__buf);
          String::append((String *)__buf,'-');
          String::append((String *)__buf,(char)*(undefined4 *)&pAVar6->argv);
          *(undefined4 *)&pAVar6->argv = 0x3a;
          this_local._7_1_ = 1;
          this = pAVar6;
        }
        goto LAB_0010584a;
      }
    }
    String::clear((String *)__buf);
    String::append((String *)__buf,'-');
    String::append((String *)__buf,(char)*(undefined4 *)&pAVar6->argv);
    *(undefined4 *)&pAVar6->argv = 0x3f;
    this_local._7_1_ = 1;
    this = pAVar6;
  }
LAB_0010584a:
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Process::Arguments::read(int& character, String& argument)
{
  if(!nextChar())
    return false;

  if(!inOpt && !skipOpt)
  {
    if(*arg == '-')
    {
      if(arg[1] == '-')
      { // handel '--' arg
        arg += 2;
        if(!*arg)
        {
          skipOpt = true;
          if(!nextChar())
            return false;
        }
        else
        {
          const char* end = String::find(arg, '=');
          usize argLen = end ? end - arg : String::length(arg);
          for(const Option* opt = options; opt < optionsEnd; ++opt)
            if(opt->name && String::compare(opt->name, arg, argLen) == 0 && !opt->name[argLen])
            {
              const char* argName = arg;
              character = opt->character;
              arg += end ? argLen + 1 : argLen;
              if(opt->flags & Process::argumentFlag)
              {
                if(end || (!(opt->flags & Process::optionalFlag) && nextChar()))
                {
                  usize len = String::length(arg);
                  argument.attach(arg, len);
                  arg += len;
                  return true;
                }
                if(!(opt->flags & Process::optionalFlag))
                {
                  // missing argument
                  argument.attach(argName - 2, argLen + 2);
                  character = ':';
                  return true;
                }
              }
              argument.clear();
              return true;
            }

          // unknown option
          character = '?';
          argLen += String::length(arg + argLen);
          argument.attach(arg - 2, argLen + 2);
          arg += argLen;
          return true;
        }
      }
      else
      {
        if(!*(++arg))
        {
          character = 0;
          argument.attach(arg - 1, 1); // "-"
          return true;
        }
        inOpt = true;
      }
    }
  }

  // find option *str
  if(inOpt)
  {
    character = *(arg++);
    for(const Option* opt = options; opt < optionsEnd; ++opt)
      if(opt->character == character)
      {
        if(opt->flags & Process::argumentFlag && !(opt->flags & Process::optionalFlag))
        {
          if(!*arg)
          {
            if(!nextChar())
            { // missing argument
              argument.clear();
              argument.append('-');
              argument.append((char)character);
              character = ':';
              return true;
            }
          }
          usize len = String::length(arg);
          argument.attach(arg, len);
          arg += len;
          return true;
        }
        argument.clear();
        return true;
      }

    // unknown option
    argument.clear();
    argument.append('-');
    argument.append((char)character);
    character = '?';
    return true;
  }

  // non option argument
  character = '\0';
  usize len = String::length(arg);
  argument.attach(arg, len);
  arg += len;
  return true;
}